

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int parse_object(frozen *f)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  byte *pbVar5;
  char *ptr;
  
  iVar2 = test_and_skip(f,0x7b);
  if ((iVar2 < 0) || (iVar2 = capture_ptr(f,f->cur + -1,JSON_TYPE_OBJECT), iVar2 < 0)) {
    return iVar2;
  }
  iVar2 = f->num_tokens;
  do {
    pbVar1 = (byte *)f->end;
    pbVar5 = (byte *)f->cur;
    if (pbVar5 < pbVar1) {
      do {
        if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) break;
        pbVar5 = pbVar5 + 1;
        f->cur = (char *)pbVar5;
      } while (pbVar5 != pbVar1);
    }
    pbVar5 = (byte *)f->cur;
    if (pbVar5 < pbVar1) {
      if (*pbVar5 == 0x7d) {
        iVar4 = test_and_skip(f,0x7d);
        if (iVar4 < 0) {
          return iVar4;
        }
        capture_len(f,iVar2 + -1,f->cur);
        return 0;
      }
      if (pbVar5 < pbVar1) {
        do {
          if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
          break;
          pbVar5 = pbVar5 + 1;
          f->cur = (char *)pbVar5;
        } while (pbVar5 != pbVar1);
      }
    }
    pbVar5 = (byte *)f->cur;
    uVar3 = 0xffffffff;
    if (pbVar5 < pbVar1) {
      uVar3 = (uint)*pbVar5;
    }
    if ((uVar3 & 0xffffffdf) - 0x5b < 0xffffffe6) {
      if (uVar3 == 0x22) {
        uVar3 = parse_string(f);
        goto joined_r0x0011243f;
      }
      uVar3 = ~(uint)(uVar3 == 0xffffffff);
    }
    else {
      if (pbVar5 < pbVar1) {
        do {
          if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
          break;
          pbVar5 = pbVar5 + 1;
          f->cur = (char *)pbVar5;
        } while (pbVar5 != pbVar1);
      }
      pbVar5 = (byte *)f->cur;
      uVar3 = 0xffffffff;
      if (((pbVar5 < pbVar1) && (0xffffffe5 < (*pbVar5 & 0xffffffdf) - 0x5b)) &&
         (uVar3 = capture_ptr(f,(char *)pbVar5,JSON_TYPE_STRING), -1 < (int)uVar3)) {
        ptr = f->cur;
        if (ptr < f->end) {
          do {
            uVar3 = (uint)*ptr;
            if ((uVar3 != 0x5f) &&
               ((uVar3 & 0xffffffdf) - 0x5b < 0xffffffe6 && uVar3 - 0x3a < 0xfffffff6)) break;
            ptr = ptr + 1;
            f->cur = ptr;
          } while (ptr != f->end);
        }
        capture_len(f,f->num_tokens + -1,ptr);
        uVar3 = 0;
      }
joined_r0x0011243f:
      if (-1 < (int)uVar3) {
        uVar3 = 0;
      }
    }
    if ((-1 < (int)uVar3) && (uVar3 = test_and_skip(f,0x3a), -1 < (int)uVar3)) {
      uVar3 = parse_value(f);
      uVar3 = (int)uVar3 >> 0x1f & uVar3;
    }
    if ((int)uVar3 < 0) {
      return uVar3;
    }
    pbVar1 = (byte *)f->end;
    pbVar5 = (byte *)f->cur;
    if (pbVar5 < pbVar1) {
      do {
        if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) break;
        pbVar5 = pbVar5 + 1;
        f->cur = (char *)pbVar5;
      } while (pbVar5 != pbVar1);
    }
    pbVar5 = (byte *)f->cur;
    if ((pbVar5 < pbVar1) && (*pbVar5 == 0x2c)) {
      f->cur = (char *)(pbVar5 + 1);
    }
  } while( true );
}

Assistant:

static int parse_object(struct frozen *f) {
    int ind;
    TRY(test_and_skip(f, '{'));
    TRY(capture_ptr(f, f->cur - 1, JSON_TYPE_OBJECT));
    ind = f->num_tokens - 1;
    while (cur(f) != '}') {
        TRY(parse_pair(f));
        if (cur(f) == ',') f->cur++;
    }
    TRY(test_and_skip(f, '}'));
    capture_len(f, ind, f->cur);
    return 0;
}